

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  int iVar1;
  void *__ptr;
  uchar **__ptr_00;
  uchar *puVar2;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  int *in_R9;
  int i;
  int est;
  int best_filter_val;
  int best_filter;
  int filter_type;
  int zlen;
  int j;
  char *line_buffer;
  uchar *zlib;
  uchar *filt;
  uchar *o;
  uchar *out;
  uchar sig [8];
  int ctype [5];
  int force_filter;
  int in_stack_ffffffffffffff5c;
  uchar **in_stack_ffffffffffffff60;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 uVar3;
  int height;
  undefined8 uVar4;
  int stride_bytes_00;
  uchar *puVar5;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int iVar7;
  uchar *local_8;
  
  uVar4 = 0xffffffff;
  puVar5 = (uchar *)0x200000004;
  uVar6 = 6;
  uVar3 = 0xa1a0a0d474e5089;
  local_84 = stbi_write_force_png_filter;
  if (4 < stbi_write_force_png_filter) {
    local_84 = -1;
  }
  __ptr = malloc((long)((in_EDX * in_R8D + 1) * in_ECX));
  if (__ptr == (void *)0x0) {
    local_8 = (uchar *)0x0;
  }
  else {
    __ptr_00 = (uchar **)malloc((long)(in_EDX * in_R8D));
    if (__ptr_00 == (uchar **)0x0) {
      free(__ptr);
      local_8 = (uchar *)0x0;
    }
    else {
      for (local_7c = 0; local_7c < in_ECX; local_7c = local_7c + 1) {
        iVar7 = local_84;
        if (local_84 < 0) {
          local_88 = 0;
          local_8c = 0x7fffffff;
          local_84 = 0;
          while( true ) {
            iVar1 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
            height = (int)((ulong)uVar3 >> 0x20);
            stride_bytes_00 = (int)((ulong)uVar4 >> 0x20);
            if (4 < local_84) break;
            in_stack_ffffffffffffff60 = __ptr_00;
            stbiw__encode_png_line
                      (puVar5,stride_bytes_00,(int)uVar4,height,(int)uVar3,iVar1,
                       in_stack_ffffffffffffffd0,(char *)in_R9);
            local_90 = 0;
            for (local_94 = 0; local_94 < in_EDX * in_R8D; local_94 = local_94 + 1) {
              iVar1 = (int)*(char *)((long)__ptr_00 + (long)local_94);
              if (iVar1 < 1) {
                iVar1 = -iVar1;
              }
              local_90 = iVar1 + local_90;
            }
            if (local_90 < local_8c) {
              local_8c = local_90;
              local_88 = local_84;
            }
            local_84 = local_84 + 1;
          }
          if (local_84 != local_88) {
            in_stack_ffffffffffffff60 = __ptr_00;
            stbiw__encode_png_line
                      (puVar5,stride_bytes_00,(int)uVar4,height,(int)uVar3,iVar1,
                       in_stack_ffffffffffffffd0,(char *)in_R9);
            local_84 = local_88;
          }
        }
        else {
          in_stack_ffffffffffffff60 = __ptr_00;
          stbiw__encode_png_line
                    (puVar5,(int)((ulong)uVar4 >> 0x20),(int)uVar4,(int)((ulong)uVar3 >> 0x20),
                     (int)uVar3,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                     in_stack_ffffffffffffffd0,(char *)in_R9);
        }
        *(char *)((long)__ptr + (long)(local_7c * (in_EDX * in_R8D + 1))) = (char)local_84;
        memmove((void *)((long)__ptr + (long)(local_7c * (in_EDX * in_R8D + 1)) + 1),__ptr_00,
                (long)(in_EDX * in_R8D));
        local_84 = iVar7;
      }
      free(__ptr_00);
      puVar5 = stbi_zlib_compress((uchar *)in_R9,local_84,
                                  (int *)CONCAT44(in_stack_ffffffffffffffcc,uVar6),
                                  (int)((ulong)puVar5 >> 0x20));
      free(__ptr);
      if (puVar5 == (uchar *)0x0) {
        local_8 = (uchar *)0x0;
      }
      else {
        puVar2 = (uchar *)malloc((long)(local_80 + 0x39));
        if (puVar2 == (uchar *)0x0) {
          local_8 = (uchar *)0x0;
        }
        else {
          *in_R9 = local_80 + 0x39;
          *(undefined8 *)puVar2 = uVar3;
          puVar2[8] = '\0';
          puVar2[9] = '\0';
          puVar2[10] = '\0';
          puVar2[0xb] = '\r';
          puVar2[0xc] = 'I';
          puVar2[0xd] = 'H';
          puVar2[0xe] = 'D';
          puVar2[0xf] = 'R';
          puVar2[0x10] = (uchar)((uint)in_EDX >> 0x18);
          puVar2[0x11] = (uchar)((uint)in_EDX >> 0x10);
          puVar2[0x12] = (uchar)((uint)in_EDX >> 8);
          puVar2[0x13] = (uchar)in_EDX;
          puVar2[0x14] = (uchar)((uint)in_ECX >> 0x18);
          puVar2[0x15] = (uchar)((uint)in_ECX >> 0x10);
          puVar2[0x16] = (uchar)((uint)in_ECX >> 8);
          puVar2[0x17] = (uchar)in_ECX;
          puVar2[0x18] = '\b';
          puVar2[0x19] = (uchar)*(undefined4 *)(&stack0xffffffffffffffb8 + (long)in_R8D * 4);
          puVar2[0x1a] = '\0';
          puVar2[0x1b] = '\0';
          puVar2[0x1c] = '\0';
          local_8 = puVar2;
          stbiw__wpcrc(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
          puVar2[0x1d] = (uchar)((uint)local_80 >> 0x18);
          puVar2[0x1e] = (uchar)((uint)local_80 >> 0x10);
          puVar2[0x1f] = (uchar)((uint)local_80 >> 8);
          puVar2[0x20] = (uchar)local_80;
          puVar2[0x21] = 'I';
          puVar2[0x22] = 'D';
          puVar2[0x23] = 'A';
          puVar2[0x24] = 'T';
          memmove(puVar2 + 0x25,puVar5,(long)local_80);
          puVar2 = puVar2 + 0x25 + local_80;
          free(puVar5);
          stbiw__wpcrc(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
          *puVar2 = '\0';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
          puVar2[4] = 'I';
          puVar2[5] = 'E';
          puVar2[6] = 'N';
          puVar2[7] = 'D';
          stbiw__wpcrc(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        }
      }
    }
  }
  return local_8;
}

Assistant:

STBIWDEF unsigned char *
stbi_write_png_to_mem(const unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len) {
    int force_filter = stbi_write_force_png_filter;
    int ctype[5] = {-1, 0, 4, 2, 6};
    unsigned char sig[8] = {137, 80, 78, 71, 13, 10, 26, 10};
    unsigned char *out, *o, *filt, *zlib;
    signed char *line_buffer;
    int j, zlen;

    if (stride_bytes == 0)
        stride_bytes = x * n;

    if (force_filter >= 5) {
        force_filter = -1;
    }

    filt = (unsigned char *) STBIW_MALLOC((x * n + 1) * y);
    if (!filt) return 0;
    line_buffer = (signed char *) STBIW_MALLOC(x * n);
    if (!line_buffer) {
        STBIW_FREE(filt);
        return 0;
    }
    for (j = 0; j < y; ++j) {
        int filter_type;
        if (force_filter > -1) {
            filter_type = force_filter;
            stbiw__encode_png_line((unsigned char *) (pixels), stride_bytes, x, y, j, n, force_filter, line_buffer);
        } else { // Estimate the best filter by running through all of them:
            int best_filter = 0, best_filter_val = 0x7fffffff, est, i;
            for (filter_type = 0; filter_type < 5; filter_type++) {
                stbiw__encode_png_line((unsigned char *) (pixels), stride_bytes, x, y, j, n, filter_type, line_buffer);

                // Estimate the entropy of the line using this filter; the less, the better.
                est = 0;
                for (i = 0; i < x * n; ++i) {
                    est += abs((signed char) line_buffer[i]);
                }
                if (est < best_filter_val) {
                    best_filter_val = est;
                    best_filter = filter_type;
                }
            }
            if (filter_type != best_filter) {  // If the last iteration already got us the best filter, don't redo it
                stbiw__encode_png_line((unsigned char *) (pixels), stride_bytes, x, y, j, n, best_filter, line_buffer);
                filter_type = best_filter;
            }
        }
        // when we get here, filter_type contains the filter type, and line_buffer contains the data
        filt[j * (x * n + 1)] = (unsigned char) filter_type;
        STBIW_MEMMOVE(filt + j * (x * n + 1) + 1, line_buffer, x * n);
    }
    STBIW_FREE(line_buffer);
    zlib = stbi_zlib_compress(filt, y * (x * n + 1), &zlen, stbi_write_png_compression_level);
    STBIW_FREE(filt);
    if (!zlib) return 0;

    // each tag requires 12 bytes of overhead
    out = (unsigned char *) STBIW_MALLOC(8 + 12 + 13 + 12 + zlen + 12);
    if (!out) return 0;
    *out_len = 8 + 12 + 13 + 12 + zlen + 12;

    o = out;
    STBIW_MEMMOVE(o, sig, 8);
    o += 8;
    stbiw__wp32(o, 13); // header length
    stbiw__wptag(o, "IHDR");
    stbiw__wp32(o, x);
    stbiw__wp32(o, y);
    *o++ = 8;
    *o++ = STBIW_UCHAR(ctype[n]);
    *o++ = 0;
    *o++ = 0;
    *o++ = 0;
    stbiw__wpcrc(&o, 13);

    stbiw__wp32(o, zlen);
    stbiw__wptag(o, "IDAT");
    STBIW_MEMMOVE(o, zlib, zlen);
    o += zlen;
    STBIW_FREE(zlib);
    stbiw__wpcrc(&o, zlen);

    stbiw__wp32(o, 0);
    stbiw__wptag(o, "IEND");
    stbiw__wpcrc(&o, 0);

    STBIW_ASSERT(o == out + *out_len);

    return out;
}